

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O2

void __thiscall
absl::flags_internal::ReportUsageError(flags_internal *this,string_view msg,bool is_fatal)

{
  ostream *poVar1;
  string_view sVar2;
  
  sVar2._M_str = (char *)msg._M_len;
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,sVar2._M_str,(long)this);
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((int)msg._M_str != 0) {
    sVar2._M_len = (size_t)this;
    AbslInternalReportFatalUsageError(sVar2);
    return;
  }
  return;
}

Assistant:

void ReportUsageError(absl::string_view msg, bool is_fatal) {
  std::cerr << "ERROR: " << msg << std::endl;

  if (is_fatal) {
    ABSL_INTERNAL_C_SYMBOL(AbslInternalReportFatalUsageError)(msg);
  }
}